

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

void __thiscall icu_63::NFFactory::~NFFactory(NFFactory *this)

{
  Hashtable *this_00;
  void *in_RSI;
  
  (this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject =
       (_func_int **)&PTR__NFFactory_0039a120;
  if (this->_delegate != (NumberFormatFactory *)0x0) {
    (*(this->_delegate->super_UObject)._vptr_UObject[1])();
  }
  this_00 = this->_ids;
  if (this_00 != (Hashtable *)0x0) {
    Hashtable::~Hashtable(this_00);
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  LocaleKeyFactory::~LocaleKeyFactory(&this->super_LocaleKeyFactory);
  return;
}

Assistant:

NFFactory::~NFFactory()
{
    delete _delegate;
    delete _ids;
}